

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.c
# Opt level: O2

void queue_message(tgestate_t *state,message_t message_index)

{
  uint8_t *puVar1;
  
  puVar1 = (state->messages).queue_pointer;
  if ((*puVar1 != 0xff) && ((puVar1[-2] != message_index || (puVar1[-1] != '\0')))) {
    *puVar1 = (uint8_t)message_index;
    puVar1[1] = '\0';
    (state->messages).queue_pointer = puVar1 + 2;
  }
  return;
}

Assistant:

void queue_message(tgestate_t *state,
                   message_t   message_index)
{
  uint8_t *qp; /* was HL */

  assert(state != NULL);
  assert(message_index >= 0 && message_index < message__LIMIT);

  qp = state->messages.queue_pointer; /* insertion point pointer */
  if (*qp == message_QUEUE_END)
    return; /* Queue full. */

  /* Is this message pending? */
  if (qp[-2] == message_index && qp[-1] == 0)
    return; /* Yes - skip adding it. */

  /* Add it to the queue. */
  qp[0] = message_index;
  qp[1] = 0;
  state->messages.queue_pointer = qp + 2;
}